

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

string * CLI::detail::ltrim(string *str)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  undefined8 local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38 [2];
  undefined8 local_28;
  undefined8 local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  string *str_local;
  
  it._M_current = (char *)str;
  local_20 = ::std::__cxx11::string::begin();
  local_28 = ::std::__cxx11::string::end();
  local_18 = ::std::
             find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>
                       (local_20,local_28);
  _Var1 = it;
  local_40._M_current = (char *)::std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_38,&local_40);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_18);
  ::std::__cxx11::string::erase(_Var1._M_current,local_38[0],local_48);
  return (string *)it._M_current;
}

Assistant:

CLI11_INLINE std::string &ltrim(std::string &str) {
    auto it = std::find_if(str.begin(), str.end(), [](char ch) { return !std::isspace<char>(ch, std::locale()); });
    str.erase(str.begin(), it);
    return str;
}